

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNamesMatchOnCornerCases_Test::TestBody
          (DescriptorTest_FieldNamesMatchOnCornerCases_Test *this)

{
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher_00
  ;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher_01
  ;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher_02
  ;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher_03
  ;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher_04
  ;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher_05
  ;
  bool bVar1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  char (*in_R9) [11];
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffba8;
  AssertHelper local_370;
  Message local_368;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_360;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_348;
  char local_328 [32];
  undefined1 local_308 [8];
  AssertionResult gtest_ar_6;
  Message local_2f0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2e8;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_2d0;
  char local_2b0 [32];
  undefined1 local_290 [8];
  AssertionResult gtest_ar_5;
  Message local_278;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_270;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_258;
  char local_238 [32];
  undefined1 local_218 [8];
  AssertionResult gtest_ar_4;
  Message local_200;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1f8;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_1e0;
  char local_1c0 [32];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_3;
  Message local_188;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_180;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_168;
  char local_148 [32];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_108;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_f0;
  char local_d0 [32];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_80;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_68;
  char local_48 [32];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  anon_class_1_0_00000001 names;
  DescriptorTest_FieldNamesMatchOnCornerCases_Test *this_local;
  
  testing::ElementsAre<char[12],char[12],char[11],char[11]>
            (&local_68,(testing *)"field_name1",(char (*) [12])"field_name1",
             (char (*) [12])"fieldName1",(char (*) [11])"fieldName1",in_R9);
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_68.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_68.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_68.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffba8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,0);
  TestBody()::$_0::operator()
            (&local_80,
             (__0 *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_28,local_48,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)0x1ceee0b);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3fc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  testing::ElementsAre<char[11],char[11],char[11],char[11]>
            (&local_f0,(testing *)"fieldName2",(char (*) [11])"fieldname2",
             (char (*) [11])"fieldName2",(char (*) [11])"fieldName2",in_R9);
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_f0.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_f0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_f0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffba8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher_00);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,1);
  TestBody()::$_0::operator()
            (&local_108,
             (__0 *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_b0,local_d0,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"names(message4_->field(1))");
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x400,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::ElementsAre<char[11],char[11],char[11],char[11]>
            (&local_168,(testing *)"FieldName3",(char (*) [11])"fieldname3",
             (char (*) [11])"fieldName3",(char (*) [11])"FieldName3",in_R9);
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_168.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_168.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_168.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffba8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher_01);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,2);
  TestBody()::$_0::operator()
            (&local_180,
             (__0 *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_128,local_148,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"names(message4_->field(2))");
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x404,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  testing::ElementsAre<char[13],char[13],char[11],char[11]>
            (&local_1e0,(testing *)"_field_name4",(char (*) [13])"_field_name4",
             (char (*) [13])"fieldName4",(char (*) [11])"FieldName4",in_R9);
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_1e0.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_1e0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_1e0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffba8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher_02);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,3);
  TestBody()::$_0::operator()
            (&local_1f8,
             (__0 *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_1a0,local_1c0,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"names(message4_->field(3))");
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x408,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  testing::ElementsAre<char[12],char[12],char[11],char[11]>
            (&local_258,(testing *)"FIELD_NAME5",(char (*) [12])"field_name5",
             (char (*) [12])"fIELDNAME5",(char (*) [11])"FIELDNAME5",in_R9);
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_258.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_258.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_258.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffba8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher_03);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,4);
  TestBody()::$_0::operator()
            (&local_270,
             (__0 *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_218,local_238,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"names(message4_->field(4))");
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x40c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  testing::ElementsAre<char[12],char[12],char[11],char[6]>
            (&local_2d0,(testing *)"field_name6",(char (*) [12])"field_name6",
             (char (*) [12])"fieldName6",(char (*) [11])"@type",(char (*) [6])in_R9);
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_2d0.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_2d0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_2d0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_04.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffba8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher_04);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,5);
  TestBody()::$_0::operator()
            (&local_2e8,
             (__0 *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_290,local_2b0,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"names(message4_->field(5))");
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x40f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  testing::ElementsAre<char[11],char[11],char[11],char[11]>
            (&local_348,(testing *)"fieldname7",(char (*) [11])"fieldname7",
             (char (*) [11])"fieldname7",(char (*) [11])"fieldname7",in_R9);
  matcher_05.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_348.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_05.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_348.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_05.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_348.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_05.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffba8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher_05);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,6);
  TestBody()::$_0::operator()
            (&local_360,
             (__0 *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_308,local_328,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)0x1ceee40);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x413,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldNamesMatchOnCornerCases) {
  const auto names = [&](auto* field) {
    return std::vector<absl::string_view>{
        field->name(), field->lowercase_name(), field->camelcase_name(),
        field->json_name()};
  };

  // field_name1
  EXPECT_THAT(
      names(message4_->field(0)),
      ElementsAre("field_name1", "field_name1", "fieldName1", "fieldName1"));
  // fieldName2
  EXPECT_THAT(
      names(message4_->field(1)),
      ElementsAre("fieldName2", "fieldname2", "fieldName2", "fieldName2"));
  // FieldName3
  EXPECT_THAT(
      names(message4_->field(2)),
      ElementsAre("FieldName3", "fieldname3", "fieldName3", "FieldName3"));
  // _field_name4
  EXPECT_THAT(
      names(message4_->field(3)),
      ElementsAre("_field_name4", "_field_name4", "fieldName4", "FieldName4"));
  // FIELD_NAME5
  EXPECT_THAT(
      names(message4_->field(4)),
      ElementsAre("FIELD_NAME5", "field_name5", "fIELDNAME5", "FIELDNAME5"));
  // field_name6, with json name @type
  EXPECT_THAT(names(message4_->field(5)),
              ElementsAre("field_name6", "field_name6", "fieldName6", "@type"));
  // fieldname7
  EXPECT_THAT(
      names(message4_->field(6)),
      ElementsAre("fieldname7", "fieldname7", "fieldname7", "fieldname7"));
}